

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode *
PVIP_node_new_intf(PVIPParserContext *parser,PVIP_node_type_t type,char *str,size_t len,int base)

{
  char *__nptr;
  longlong n_00;
  PVIPNode *pPVar1;
  int64_t n;
  char *pcStack_40;
  int i;
  char *bufp;
  char *buf;
  int base_local;
  size_t len_local;
  char *str_local;
  PVIP_node_type_t type_local;
  PVIPParserContext *parser_local;
  
  __nptr = (char *)malloc(len + 1);
  pcStack_40 = __nptr;
  for (n._4_4_ = 0; (ulong)(long)n._4_4_ < len; n._4_4_ = n._4_4_ + 1) {
    if (str[n._4_4_] != '_') {
      *pcStack_40 = str[n._4_4_];
      pcStack_40 = pcStack_40 + 1;
    }
  }
  *pcStack_40 = '\0';
  n_00 = strtoll(__nptr,(char **)0x0,base);
  free(__nptr);
  pPVar1 = PVIP_node_new_int(parser,type,n_00);
  return pPVar1;
}

Assistant:

PVIPNode * PVIP_node_new_intf(PVIPParserContext* parser, PVIP_node_type_t type, const char *str, size_t len, int base) {
    char * buf = malloc(len+1);
    char *bufp = buf;
    int i;
    for (i=0; i<len; i++) {
        if (str[i] != '_') {
            *bufp++ = str[i];
        }
    }
    *bufp++ = '\0';
    int64_t n = strtoll(buf, NULL, base);
    free(buf);
    return PVIP_node_new_int(parser, type, n);
}